

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CBlit.h
# Opt level: O2

void irr::executeBlit_TextureCopy_x_to_x(SBlitJob *job)

{
  int iVar1;
  u32 uVar2;
  void *pvVar3;
  u32 dy;
  uint uVar4;
  u32 dy_2;
  u32 dy_1;
  int iVar5;
  u32 uVar6;
  u32 dx;
  ulong uVar7;
  int iVar8;
  u32 dx_1;
  void *pvVar9;
  float fVar10;
  float fVar11;
  
  if (job->stretch == true) {
    fVar10 = floorf((float)job->x_stretch * 262144.0 + 0.0);
    fVar11 = floorf((float)job->y_stretch * 262144.0 + 0.0);
    if (job->srcPixelMul == 2) {
      pvVar3 = job->dst;
      uVar2 = job->height;
      iVar5 = 0;
      for (uVar6 = 0; uVar6 != uVar2; uVar6 = uVar6 + 1) {
        iVar1 = job->srcPitch;
        pvVar9 = job->src;
        uVar4 = job->width;
        iVar8 = 0;
        for (uVar7 = 0; uVar4 != uVar7; uVar7 = uVar7 + 1) {
          *(undefined2 *)((long)pvVar3 + uVar7 * 2) =
               *(undefined2 *)
                ((long)pvVar9 + (long)(iVar8 >> 0x12) * 2 + (long)(iVar5 >> 0x12) * (long)iVar1);
          iVar8 = iVar8 + (int)fVar10;
        }
        pvVar3 = (void *)((long)pvVar3 + (ulong)job->dstPitch);
        iVar5 = iVar5 + (int)fVar11;
      }
    }
    else if (job->srcPixelMul == 4) {
      pvVar3 = job->dst;
      iVar5 = 0;
      for (uVar4 = 0; uVar4 < job->height; uVar4 = uVar4 + 1) {
        iVar1 = job->srcPitch;
        pvVar9 = job->src;
        iVar8 = 0;
        for (uVar7 = 0; uVar7 < job->width; uVar7 = uVar7 + 1) {
          *(undefined4 *)((long)pvVar3 + uVar7 * 4) =
               *(undefined4 *)
                ((long)pvVar9 + (long)(iVar8 >> 0x12) * 4 + (long)(iVar5 >> 0x12) * (long)iVar1);
          iVar8 = iVar8 + (int)fVar10;
        }
        pvVar3 = (void *)((long)pvVar3 + (ulong)job->dstPitch);
        iVar5 = iVar5 + (int)fVar11;
      }
    }
  }
  else {
    uVar2 = job->dstPixelMul;
    uVar6 = job->width;
    pvVar3 = job->src;
    pvVar9 = job->dst;
    for (uVar4 = 0; uVar4 < job->height; uVar4 = uVar4 + 1) {
      memcpy(pvVar9,pvVar3,(ulong)(uVar2 * uVar6));
      pvVar3 = (void *)((long)pvVar3 + (long)job->srcPitch);
      pvVar9 = (void *)((long)pvVar9 + (ulong)job->dstPitch);
    }
  }
  return;
}

Assistant:

static void executeBlit_TextureCopy_x_to_x(const SBlitJob *job)
{
	if (job->stretch) {
		const f18 wscale = f32_to_f18(job->x_stretch);
		const f18 hscale = f32_to_f18(job->y_stretch);

		f18 src_y = f18_zero;

		if (job->srcPixelMul == 4) {
			const u32 *src = (u32 *)(job->src);
			u32 *dst = (u32 *)(job->dst);

			for (u32 dy = 0; dy < job->height; ++dy, src_y += hscale) {
				src = (u32 *)((u8 *)(job->src) + job->srcPitch * f18_floor(src_y));

				f18 src_x = f18_zero;
				for (u32 dx = 0; dx < job->width; ++dx, src_x += wscale) {
					dst[dx] = src[f18_floor(src_x)];
				}
				dst = (u32 *)((u8 *)(dst) + job->dstPitch);
			}
		} else if (job->srcPixelMul == 2) {
			const u16 *src = (u16 *)(job->src);
			u16 *dst = (u16 *)(job->dst);

			for (u32 dy = 0; dy < job->height; ++dy, src_y += hscale) {
				src = (u16 *)((u8 *)(job->src) + job->srcPitch * f18_floor(src_y));

				f18 src_x = f18_zero;
				for (u32 dx = 0; dx < job->width; ++dx, src_x += wscale) {
					dst[dx] = src[f18_floor(src_x)];
				}
				dst = (u16 *)((u8 *)(dst) + job->dstPitch);
			}
		}
	} else {
		const size_t widthPitch = job->width * job->dstPixelMul;
		const void *src = (void *)job->src;
		void *dst = (void *)job->dst;

		for (u32 dy = 0; dy < job->height; ++dy) {
			memcpy(dst, src, widthPitch);

			src = (void *)((u8 *)(src) + job->srcPitch);
			dst = (void *)((u8 *)(dst) + job->dstPitch);
		}
	}
}